

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnCompare_double(void *v1,void *v2)

{
  double *i2;
  double *i1;
  void *v2_local;
  void *v1_local;
  undefined4 local_4;
  
  if (*v2 <= *v1) {
    if (*v1 < *v2 || *v1 == *v2) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int FnCompare_double(const void *v1, const void *v2)
{
   const double *i1 = v1;
   const double *i2 = v2;
   
   if (*i1 < *i2)
     return(-1);
   else if (*i1 > *i2)
     return(1);
   else
     return(0);
}